

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.h
# Opt level: O2

Node<NimState> * __thiscall
MCTS::Node<NimState>::add_child(Node<NimState> *this,Move *move,NimState *state)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  Node<NimState> *this_00;
  int *piVar4;
  Node<NimState> *node;
  
  this_00 = (Node<NimState> *)operator_new(0x60);
  Node(this_00,state,move,this);
  node = this_00;
  std::vector<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>::push_back
            (&this->children,&node);
  if ((this->children).
      super__Vector_base<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->children).
      super__Vector_base<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    assertion_failed("! children.empty()",
                     "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/mcts.h"
                     ,0xf2);
  }
  piVar2 = (this->moves).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (this->moves).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar1 = *move;
  piVar4 = piVar2;
  while( true ) {
    if (piVar4 == piVar3) {
      assertion_failed("itr != moves.end()",
                       "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/mcts.h"
                       ,0xf6);
    }
    if (*piVar4 == iVar1) break;
    piVar4 = piVar4 + 1;
  }
  *piVar4 = piVar3[-1];
  piVar3[-1] = iVar1;
  std::vector<int,_std::allocator<int>_>::resize
            (&this->moves,((long)piVar3 - (long)piVar2 >> 2) - 1);
  return node;
}

Assistant:

Node<State>* Node<State>::add_child(const Move& move, const State& state)
{
	auto node = new Node(state, move, this);
	children.push_back(node);
	attest( ! children.empty());

	auto itr = moves.begin();
	for (; itr != moves.end() && *itr != move; ++itr);
	attest(itr != moves.end());
	std::iter_swap(itr, moves.end() - 1);
	moves.resize(moves.size() - 1);
	return node;
}